

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

ATNNode<unsigned_char> * __thiscall
Centaurus::Grammar<unsigned_char>::resolve(Grammar<unsigned_char> *this,ATNPath *path)

{
  int index;
  Identifier *__k;
  mapped_type *this_00;
  ATNNode<unsigned_char> *pAVar1;
  ATNPath *path_local;
  Grammar<unsigned_char> *this_local;
  
  __k = ATNPath::leaf_id(path);
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
            ::at(&this->m_networks,__k);
  index = ATNPath::leaf_index(path);
  pAVar1 = ATNMachine<unsigned_char>::get_node(this_00,index);
  return pAVar1;
}

Assistant:

const ATNNode<TCHAR>& resolve(const ATNPath& path) const
    {
        return m_networks.at(path.leaf_id()).get_node(path.leaf_index());
    }